

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(DescriptorKeyInfo *this,DescriptorKeyInfo *object)

{
  undefined3 uVar1;
  NetType NVar2;
  uint32_t uVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  (this->parent_info_)._M_dataplus._M_p = (pointer)&(this->parent_info_).field_2;
  (this->parent_info_)._M_string_length = 0;
  (this->parent_info_).field_2._M_local_buf[0] = '\0';
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  (this->key_string_)._M_dataplus._M_p = (pointer)&(this->key_string_).field_2;
  (this->key_string_)._M_string_length = 0;
  (this->key_string_).field_2._M_local_buf[0] = '\0';
  this->key_type_ = object->key_type_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->pubkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->schnorr_pubkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->privkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->privkey_);
  uVar1 = *(undefined3 *)&(object->privkey_).field_0x19;
  NVar2 = (object->privkey_).net_type_;
  (this->privkey_).is_compressed_ = (object->privkey_).is_compressed_;
  *(undefined3 *)&(this->privkey_).field_0x19 = uVar1;
  (this->privkey_).net_type_ = NVar2;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extprivkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->extprivkey_);
  uVar3 = (object->extprivkey_).fingerprint_;
  uVar4 = (object->extprivkey_).depth_;
  uVar1 = *(undefined3 *)&(object->extprivkey_).field_0x21;
  uVar5 = (object->extprivkey_).child_num_;
  (this->extprivkey_).version_ = (object->extprivkey_).version_;
  (this->extprivkey_).fingerprint_ = uVar3;
  (this->extprivkey_).depth_ = uVar4;
  *(undefined3 *)&(this->extprivkey_).field_0x21 = uVar1;
  (this->extprivkey_).child_num_ = uVar5;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(this->extprivkey_).chaincode_,&(object->extprivkey_).chaincode_.data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extprivkey_).privkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(object->extprivkey_).privkey_);
  uVar1 = *(undefined3 *)&(object->extprivkey_).privkey_.field_0x19;
  NVar2 = (object->extprivkey_).privkey_.net_type_;
  (this->extprivkey_).privkey_.is_compressed_ = (object->extprivkey_).privkey_.is_compressed_;
  *(undefined3 *)&(this->extprivkey_).privkey_.field_0x19 = uVar1;
  (this->extprivkey_).privkey_.net_type_ = NVar2;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(this->extprivkey_).tweak_sum_,&(object->extprivkey_).tweak_sum_.data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extpubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->extpubkey_);
  uVar3 = (object->extpubkey_).fingerprint_;
  uVar4 = (object->extpubkey_).depth_;
  uVar1 = *(undefined3 *)&(object->extpubkey_).field_0x21;
  uVar5 = (object->extpubkey_).child_num_;
  (this->extpubkey_).version_ = (object->extpubkey_).version_;
  (this->extpubkey_).fingerprint_ = uVar3;
  (this->extpubkey_).depth_ = uVar4;
  *(undefined3 *)&(this->extpubkey_).field_0x21 = uVar1;
  (this->extpubkey_).child_num_ = uVar5;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extpubkey_).chaincode_
             ,&(object->extpubkey_).chaincode_.data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extpubkey_).pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(object->extpubkey_).pubkey_)
  ;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extpubkey_).tweak_sum_
             ,&(object->extpubkey_).tweak_sum_.data_);
  ::std::__cxx11::string::_M_assign((string *)&this->parent_info_);
  ::std::__cxx11::string::_M_assign((string *)&this->path_);
  ::std::__cxx11::string::_M_assign((string *)&this->key_string_);
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(const DescriptorKeyInfo& object) {
  key_type_ = object.key_type_;
  pubkey_ = object.pubkey_;
  schnorr_pubkey_ = object.schnorr_pubkey_;
  privkey_ = object.privkey_;
  extprivkey_ = object.extprivkey_;
  extpubkey_ = object.extpubkey_;
  parent_info_ = object.parent_info_;
  path_ = object.path_;
  key_string_ = object.key_string_;
}